

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void write_prefix_nal_unit_svc(nal_t *nal,bs_t *b)

{
  _Bool _Var1;
  byte *pbVar2;
  int iVar3;
  
  if (nal->nal_ref_idc == 0) {
    iVar3 = more_rbsp_data(b);
    if (iVar3 != 0) {
      while (iVar3 = more_rbsp_data(b), iVar3 != 0) {
        _Var1 = nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag;
        iVar3 = b->bits_left + -1;
        b->bits_left = iVar3;
        pbVar2 = b->p;
        if (pbVar2 < b->end) {
          *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
          *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
        }
        if (b->bits_left == 0) {
          b->p = b->p + 1;
          b->bits_left = 8;
        }
      }
    }
  }
  else {
    _Var1 = nal->prefix_nal_svc->store_ref_base_pic_flag;
    iVar3 = b->bits_left + -1;
    b->bits_left = iVar3;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    if (((nal->nal_svc_ext->use_ref_base_pic_flag != false) ||
        (nal->prefix_nal_svc->store_ref_base_pic_flag == true)) &&
       (nal->nal_svc_ext->idr_flag == false)) {
      write_dec_ref_base_pic_marking(nal,b);
    }
    _Var1 = nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag;
    iVar3 = b->bits_left + -1;
    b->bits_left = iVar3;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    if (nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag == true) {
      while (iVar3 = more_rbsp_data(b), iVar3 != 0) {
        _Var1 = nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag;
        iVar3 = b->bits_left + -1;
        b->bits_left = iVar3;
        pbVar2 = b->p;
        if (pbVar2 < b->end) {
          *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
          *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
        }
        if (b->bits_left == 0) {
          b->p = b->p + 1;
          b->bits_left = 8;
        }
      }
    }
  }
  return;
}

Assistant:

void write_prefix_nal_unit_svc(nal_t* nal, bs_t* b)
{
    if( nal->nal_ref_idc != 0 )
    {
        bs_write_u1(b, nal->prefix_nal_svc->store_ref_base_pic_flag);
        if( ( nal->nal_svc_ext->use_ref_base_pic_flag || nal->prefix_nal_svc->store_ref_base_pic_flag ) &&
             !nal->nal_svc_ext->idr_flag )
        {
            write_dec_ref_base_pic_marking( nal, b );
        }
        bs_write_u1(b, nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag);
        if( nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag )
        {
            while( more_rbsp_data( b ) )
            {
                bs_write_u1(b, nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag);
            }
        }
    }
    else if( more_rbsp_data( b ) )
    {
        while( more_rbsp_data( b ) )
        {
            bs_write_u1(b, nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag);
        }
    }
}